

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_process_empty_scalar(yaml_parser_t *parser,yaml_event_t *event,yaml_mark_t mark)

{
  yaml_char_t *pyVar1;
  yaml_char_t *value;
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  pyVar1 = (yaml_char_t *)yaml_malloc(1);
  if (pyVar1 != (yaml_char_t *)0x0) {
    *pyVar1 = '\0';
    memset(event,0,0x68);
    event->type = YAML_SCALAR_EVENT;
    (event->start_mark).index = mark.index;
    (event->start_mark).line = mark.line;
    (event->start_mark).column = mark.column;
    (event->end_mark).index = mark.index;
    (event->end_mark).line = mark.line;
    (event->end_mark).column = mark.column;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).scalar.value = pyVar1;
    (event->data).scalar.length = 0;
    (event->data).scalar.plain_implicit = 1;
    (event->data).scalar.quoted_implicit = 0;
    (event->data).scalar.style = YAML_PLAIN_SCALAR_STYLE;
  }
  else {
    parser->error = YAML_MEMORY_ERROR;
  }
  parser_local._4_4_ = (uint)(pyVar1 != (yaml_char_t *)0x0);
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_process_empty_scalar(yaml_parser_t *parser, yaml_event_t *event,
        yaml_mark_t mark)
{
    yaml_char_t *value;

    value = YAML_MALLOC(1);
    if (!value) {
        parser->error = YAML_MEMORY_ERROR;
        return 0;
    }
    value[0] = '\0';

    SCALAR_EVENT_INIT(*event, NULL, NULL, value, 0,
            1, 0, YAML_PLAIN_SCALAR_STYLE, mark, mark);

    return 1;
}